

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

double __thiscall r_exec::Group::update_c_act(Group *this)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  float fVar3;
  double dVar4;
  Atom local_c [4];
  
  if (this->c_act_changes != 0) {
    fVar3 = get_c_act(this);
    dVar1 = this->acc_c_act /
            (((double)CONCAT44(0x45300000,(int)(this->c_act_changes >> 0x20)) -
             1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->c_act_changes) - 4503599627370496.0)) +
            (double)fVar3;
    dVar4 = 0.0;
    if ((0.0 <= dVar1) && (dVar4 = dVar1, 1.0 < dVar1)) {
      dVar4 = 1.0;
    }
    r_code::Atom::Float((float)dVar4);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,7);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_c);
    r_code::Atom::~Atom(local_c);
  }
  this->c_act_changes = 0;
  this->acc_c_act = 0.0;
  fVar3 = get_c_act(this);
  return (double)fVar3;
}

Assistant:

double Group::update_c_act()
{
    if (c_act_changes) {
        double new_c_act = get_c_act() + acc_c_act / c_act_changes;

        if (new_c_act < 0) {
            new_c_act = 0;
        } else if (new_c_act > 1) {
            new_c_act = 1;
        }

        code(GRP_C_ACT) = r_code::Atom::Float(new_c_act);
    }

    acc_c_act = 0;
    c_act_changes = 0;
    return get_c_act();
}